

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# kparser.cpp
# Opt level: O2

int __thiscall KParser::_var(KParser *this,int begin,BlockInfo bi)

{
  pointer pTVar1;
  allocator local_139;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_138;
  char buf [256];
  
  pTVar1 = (this->m_tokens).super__Vector_base<Token,_std::allocator<Token>_>._M_impl.
           super__Vector_impl_data._M_start;
  if (pTVar1[begin].tokenType == _var) {
    if (pTVar1[(long)begin + 1].tokenType == id) {
      if (pTVar1[(long)begin + 2].tokenType == semicolon) {
        return begin + 3;
      }
      sprintf(buf,anon_var_dwarf_13559,(ulong)(uint)pTVar1[(long)begin + 2].line);
      std::__cxx11::string::string((string *)&local_138,buf,&local_139);
      std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
      emplace_back<std::__cxx11::string>
                ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)
                 &this->m_errorMsgs,&local_138);
    }
    else {
      sprintf(buf,anon_var_dwarf_13540,(ulong)(uint)pTVar1[(long)begin + 1].line);
      std::__cxx11::string::string((string *)&local_138,buf,&local_139);
      std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
      emplace_back<std::__cxx11::string>
                ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)
                 &this->m_errorMsgs,&local_138);
    }
    std::__cxx11::string::~string((string *)&local_138);
  }
  return -1;
}

Assistant:

int KParser::_var(int begin,  BlockInfo bi) {
    int i = begin;
    int t = 0;

    if (m_tokens[i].tokenType != TokenType::_var) {
        return -1;
    }
    i++;

    if (m_tokens[i].tokenType != TokenType::id) {
        char buf[256];
        sprintf(buf, "line[%d]: 식별자가 빠졌습니다.\n", m_tokens[i].line);
        m_errorMsgs.push_back(buf);
        return -1;
    }
    i++;

    if (m_tokens[i].tokenType != TokenType::semicolon) {
        char buf[256];
        sprintf(buf, "line[%d]: ; 가 빠졌습니다.\n", m_tokens[i].line);
        m_errorMsgs.push_back(buf);
        return -1;
    }
    i++;
    return i;
}